

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetNameIfExistsNode::Evaluate
          (string *__return_storage_ptr__,TargetNameIfExistsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  string *input;
  bool bVar1;
  cmTarget *pcVar2;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  input = (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)input == 0x20) {
    if ((input->_M_string_length != 0) &&
       (bVar1 = cmGeneratorExpression::IsValidTargetName(input), bVar1)) {
      pcVar2 = cmMakefile::FindTargetToUse(context->LG->Makefile,input,false);
      if (pcVar2 != (cmTarget *)0x0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
        return __return_storage_ptr__;
      }
      goto LAB_003e1a41;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_40,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "$<TARGET_NAME_IF_EXISTS:tgt> expression requires a non-empty valid target name.",
               &local_61);
    reportError(context,&local_40,&local_60);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_40,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"$<TARGET_NAME_IF_EXISTS:...> expression requires one parameter",
               &local_61);
    reportError(context,&local_40,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
LAB_003e1a41:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    if (parameters.size() != 1) {
      reportError(context, content->GetOriginalExpression(),
                  "$<TARGET_NAME_IF_EXISTS:...> expression requires one "
                  "parameter");
      return std::string();
    }

    std::string const& targetName = parameters.front();
    if (targetName.empty() ||
        !cmGeneratorExpression::IsValidTargetName(targetName)) {
      reportError(context, content->GetOriginalExpression(),
                  "$<TARGET_NAME_IF_EXISTS:tgt> expression requires a "
                  "non-empty valid target name.");
      return std::string();
    }

    return context->LG->GetMakefile()->FindTargetToUse(targetName)
      ? targetName
      : std::string();
  }